

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

void __thiscall Shell::FunctionDefinition::~FunctionDefinition(FunctionDefinition *this)

{
  undefined1 uVar1;
  Def *pDVar2;
  Iterator dit;
  DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  Def *in_stack_ffffffffffffffe0;
  
  Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::Iterator::
  Iterator((Iterator *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8);
  while (uVar1 = Lib::
                 DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::
                 Iterator::hasNext((Iterator *)0xb9c91b), (bool)uVar1) {
    pDVar2 = Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
             ::Iterator::next((Iterator *)0xb9c935);
    if (pDVar2 != (Def *)0x0) {
      Def::~Def(in_stack_ffffffffffffffe0);
      ::operator_delete(pDVar2,0x40);
    }
  }
  Lib::MultiCounter::~MultiCounter((MultiCounter *)0xb9c96c);
  Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack
            ((Stack<Shell::FunctionDefinition::Def_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack
            ((Stack<Shell::FunctionDefinition::Def_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            ((DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

FunctionDefinition::~FunctionDefinition ()
{
  Fn2DefMap::Iterator dit(_defs);
  while(dit.hasNext()) {
    delete dit.next();
  }
}